

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O1

MatrixXd * __thiscall ANN::predict(MatrixXd *__return_storage_ptr__,ANN *this,MatrixXd *input)

{
  pointer ppLVar1;
  Layer *pLVar2;
  double *__ptr;
  Index IVar3;
  Index IVar4;
  pointer ppLVar5;
  double *local_60;
  Index local_58;
  Index IStack_50;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  ppLVar5 = (this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppLVar1 = (this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppLVar5 != ppLVar1) {
    do {
      pLVar2 = *ppLVar5;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)input);
      (**pLVar2->_vptr_Layer)(&local_60,pLVar2,&local_48);
      __ptr = (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_data;
      (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
           local_60;
      IVar3 = (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      IVar4 = (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows =
           local_58;
      (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols =
           IStack_50;
      local_60 = __ptr;
      local_58 = IVar3;
      IStack_50 = IVar4;
      free(__ptr);
      free(local_48.m_data);
      ppLVar5 = ppLVar5 + 1;
    } while (ppLVar5 != ppLVar1);
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data =
       (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  IVar3 = (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows =
       (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = IVar3;
  (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
       (double *)0x0;
  (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows = 0;
  (input->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols = 0;
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd ANN::predict(Eigen::MatrixXd input) {
    for(auto layer : layers) {
        input = layer->forward(input);
    }
    return input;
}